

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scpserver.c
# Opt level: O1

void scp_source_push_name(ScpSource *scp,ptrlen pathname,fxp_attrs attrs,char *wc)

{
  uint uVar1;
  size_t s;
  char *fmt;
  
  s = pathname.len;
  if (((undefined1  [56])attrs & (undefined1  [56])0x4) == (undefined1  [56])0x0) {
    uVar1 = string_length_for_printf(s);
    fmt = "unable to read file permissions for %.*s";
  }
  else if (((undefined1  [56])attrs & (undefined1  [56])0x4000) == (undefined1  [56])0x0) {
    if (((undefined1  [56])attrs & (undefined1  [56])0x1) != (undefined1  [56])0x0) {
LAB_0011275e:
      scp_source_push(scp,SCP_NAME,pathname,(ptrlen)ZEXT816(0x179c73),&attrs,wc);
      return;
    }
    uVar1 = string_length_for_printf(s);
    fmt = "unable to read file size for %.*s";
  }
  else {
    if ((wc != (char *)0x0) || (scp->recursive != false)) goto LAB_0011275e;
    uVar1 = string_length_for_printf(s);
    fmt = "%.*s: is a directory";
  }
  scp_source_err(scp,fmt,(ulong)uVar1,pathname.ptr);
  return;
}

Assistant:

static void scp_source_push_name(
    ScpSource *scp, ptrlen pathname, struct fxp_attrs attrs, const char *wc)
{
    if (!(attrs.flags & SSH_FILEXFER_ATTR_PERMISSIONS)) {
        scp_source_err(scp, "unable to read file permissions for %.*s",
                       PTRLEN_PRINTF(pathname));
        return;
    }
    if (attrs.permissions & PERMS_DIRECTORY) {
        if (!scp->recursive && !wc) {
            scp_source_err(scp, "%.*s: is a directory",
                           PTRLEN_PRINTF(pathname));
            return;
        }
    } else {
        if (!(attrs.flags & SSH_FILEXFER_ATTR_SIZE)) {
            scp_source_err(scp, "unable to read file size for %.*s",
                           PTRLEN_PRINTF(pathname));
            return;
        }
    }

    scp_source_push(scp, SCP_NAME, pathname, PTRLEN_LITERAL(""), &attrs, wc);
}